

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
double_writer::operator()(double_writer *this,char **it)

{
  undefined1 *puVar1;
  long lVar2;
  char *begin;
  type pcVar3;
  undefined8 *in_RSI;
  long *in_RDI;
  char *in_stack_ffffffffffffffd8;
  
  if ((char)in_RDI[1] != '\0') {
    lVar2 = in_RDI[1];
    puVar1 = (undefined1 *)*in_RSI;
    *in_RSI = puVar1 + 1;
    *puVar1 = (char)lVar2;
    *in_RDI = *in_RDI + -1;
  }
  begin = internal::basic_buffer<char>::begin((basic_buffer<char> *)in_RDI[2]);
  internal::basic_buffer<char>::end((basic_buffer<char> *)in_RDI[2]);
  pcVar3 = internal::copy_str<char,char*,char*>(begin,in_stack_ffffffffffffffd8,(char *)0x15adad);
  *in_RSI = pcVar3;
  return;
}

Assistant:

void operator()(It &&it) {
      if (sign) {
        *it++ = static_cast<char_type>(sign);
        --n;
      }
      it = internal::copy_str<char_type>(buffer.begin(), buffer.end(), it);
    }